

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void prvTidypushMemory(TidyDocImpl *doc,TidyParserMemory data)

{
  uint *puVar1;
  uint uVar2;
  TidyParserMemory *pTVar3;
  int iVar4;
  TidyParserMemory *__dest;
  
  uVar2 = (doc->stack).size;
  iVar4 = (doc->stack).top;
  if (iVar4 == uVar2 - 1) {
    __dest = (TidyParserMemory *)(*doc->allocator->vtbl->alloc)(doc->allocator,(ulong)uVar2 * 0x60);
    memcpy(__dest,(doc->stack).content,(long)(doc->stack).top * 0x30 + 0x30);
    (*doc->allocator->vtbl->free)(doc->allocator,(doc->stack).content);
    (doc->stack).content = __dest;
    puVar1 = &(doc->stack).size;
    *puVar1 = *puVar1 << 1;
    iVar4 = (doc->stack).top;
  }
  else {
    __dest = (doc->stack).content;
  }
  iVar4 = iVar4 + 1;
  (doc->stack).top = iVar4;
  pTVar3 = __dest + iVar4;
  pTVar3->mode = data.mode;
  pTVar3->register_1 = data.register_1;
  *(undefined8 *)(&pTVar3->mode + 2) = data._40_8_;
  __dest[iVar4].reentry_node = data.reentry_node;
  (&__dest[iVar4].reentry_node)[1] = (Node *)data._24_8_;
  __dest[iVar4].identity = data.identity;
  __dest[iVar4].original_node = data.original_node;
  return;
}

Assistant:

void TY_(pushMemory)( TidyDocImpl* doc, TidyParserMemory data )
{
    if ( doc->stack.top == doc->stack.size - 1 )
        growParserStack( doc );

    doc->stack.top++;
    
    doc->stack.content[doc->stack.top] = data;
    DEBUG_LOG(SPRTF("\n"
                    "-->PUSH original: %s @ %p\n"
                    "         reentry: %s @ %p\n"
                    "     stack depth: %lu @ %p\n"
                    "            mode: %u\n"
                    "      register 1: %i\n"
                    "      register 2: %i\n\n",
                    data.original_node ? data.original_node->element : "none", data.original_node,
                    data.reentry_node ? data.reentry_node->element : "none", data.reentry_node,
                    doc->stack.top, &doc->stack.content[doc->stack.top],
                    data.mode,
                    data.register_1,
                    data.register_2
                    ));
}